

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O1

char * duckdb_yyjson::yyjson_mut_write_opts
                 (yyjson_mut_doc *doc,yyjson_write_flag flg,yyjson_alc *alc_ptr,usize *dat_len,
                 yyjson_write_err *err)

{
  char *pcVar1;
  yyjson_val_chunk *pyVar2;
  usize estimated_val_num;
  yyjson_mut_val *val;
  
  if (doc == (yyjson_mut_doc *)0x0) {
    val = (yyjson_mut_val *)0x0;
    estimated_val_num = 0;
  }
  else {
    val = doc->root;
    pyVar2 = (doc->val_pool).chunks;
    if (pyVar2 == (yyjson_val_chunk *)0x0) {
      estimated_val_num = 0;
    }
    else {
      estimated_val_num = 0;
      do {
        estimated_val_num = (estimated_val_num + pyVar2->chunk_size / 0x18) - 1;
        if (pyVar2 == (doc->val_pool).chunks) {
          estimated_val_num =
               estimated_val_num + ((long)(doc->val_pool).end - (long)(doc->val_pool).cur) / -0x18;
        }
        pyVar2 = pyVar2->next;
      } while (pyVar2 != (yyjson_val_chunk *)0x0);
    }
  }
  pcVar1 = yyjson_mut_write_opts_impl(val,estimated_val_num,flg,alc_ptr,dat_len,err);
  return pcVar1;
}

Assistant:

char *yyjson_mut_write_opts(const yyjson_mut_doc *doc,
                            yyjson_write_flag flg,
                            const yyjson_alc *alc_ptr,
                            usize *dat_len,
                            yyjson_write_err *err) {
    yyjson_mut_val *root;
    usize estimated_val_num;
    if (likely(doc)) {
        root = doc->root;
        estimated_val_num = yyjson_mut_doc_estimated_val_num(doc);
    } else {
        root = NULL;
        estimated_val_num = 0;
    }
    return yyjson_mut_write_opts_impl(root, estimated_val_num,
                                      flg, alc_ptr, dat_len, err);
}